

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::emplace<QTextLayout::FormatRange_const&>
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,FormatRange *args)

{
  FormatRange **ppFVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  FormatRange *pFVar4;
  FormatRange *pFVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_78;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
           super_QArrayDataPointer<QTextLayout::FormatRange>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004286ab:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50._0_4_ = args->start;
    local_50._4_4_ = args->length;
    QTextFormat::QTextFormat((QTextFormat *)&local_48,&(args->format).super_QTextFormat);
    bVar7 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
            super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
    QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
              ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar7),1,
               (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
    if (i == 0 && bVar7) {
      pFVar4 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      pFVar4[-1].start = (undefined4)local_50;
      pFVar4[-1].length = local_50._4_4_;
      QTextFormat::QTextFormat(&pFVar4[-1].format.super_QTextFormat,(QTextFormat *)&local_48);
      ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      *ppFVar1 = *ppFVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                super_QArrayDataPointer<QTextLayout::FormatRange>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pFVar5 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      pFVar4 = pFVar5 + i + 1;
      local_78.nInserts = 1;
      local_78.bytes =
           ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
            super_QArrayDataPointer<QTextLayout::FormatRange>.size - i) * 0x18;
      local_78.data = (QArrayDataPointer<QTextLayout::FormatRange> *)this;
      local_78.displaceTo = pFVar4;
      memmove(pFVar4,pFVar5 + i,local_78.bytes);
      pFVar4[-1].start = (undefined4)local_50;
      pFVar4[-1].length = local_50._4_4_;
      QTextFormat::QTextFormat(&pFVar5[i].format.super_QTextFormat,(QTextFormat *)&local_48);
      local_78.displaceFrom = pFVar4;
      Inserter::~Inserter(&local_78);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  }
  else {
    if (((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
         super_QArrayDataPointer<QTextLayout::FormatRange>.size == i) &&
       (pFVar4 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pFVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      iVar6 = args->length;
      pFVar4 = pFVar4 + i;
      pFVar4->start = args->start;
      pFVar4->length = iVar6;
      QTextFormat::QTextFormat
                (&(pFVar4->format).super_QTextFormat,&(args->format).super_QTextFormat);
    }
    else {
      if ((i != 0) ||
         (pFVar4 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                   super_QArrayDataPointer<QTextLayout::FormatRange>.ptr,
         (FormatRange *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pFVar4)) goto LAB_004286ab;
      iVar6 = args->length;
      pFVar4[-1].start = args->start;
      pFVar4[-1].length = iVar6;
      QTextFormat::QTextFormat
                (&pFVar4[-1].format.super_QTextFormat,&(args->format).super_QTextFormat);
      ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
      *ppFVar1 = *ppFVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
              super_QArrayDataPointer<QTextLayout::FormatRange>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }